

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,Timer *timer,HttpHeaderTable *responseHeaderTable,NetworkAddress *addr,
                 HttpClientSettings *settings)

{
  HttpClientSettings *params_3;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar1;
  Own<kj::NetworkAddress,_std::nullptr_t> local_50;
  HttpClientSettings *local_30;
  HttpClientSettings *settings_local;
  NetworkAddress *addr_local;
  HttpHeaderTable *responseHeaderTable_local;
  Timer *timer_local;
  
  local_30 = settings;
  settings_local = (HttpClientSettings *)addr;
  addr_local = (NetworkAddress *)responseHeaderTable;
  responseHeaderTable_local = (HttpHeaderTable *)timer;
  timer_local = (Timer *)this;
  Own<kj::NetworkAddress,_std::nullptr_t>::Own(&local_50,addr,(Disposer *)&NullDisposer::instance);
  params_3 = mv<kj::HttpClientSettings>(settings);
  heap<kj::(anonymous_namespace)::NetworkAddressHttpClient,kj::Timer&,kj::HttpHeaderTable_const&,kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::HttpClientSettings>
            ((kj *)&stack0xffffffffffffffc0,timer,responseHeaderTable,&local_50,params_3);
  Own<kj::HttpClient,decltype(nullptr)>::
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,void>
            ((Own<kj::HttpClient,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)
             &stack0xffffffffffffffc0);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)
             &stack0xffffffffffffffc0);
  Own<kj::NetworkAddress,_std::nullptr_t>::~Own(&local_50);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<HttpClient> newHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                                  kj::NetworkAddress& addr, HttpClientSettings settings) {
  return kj::heap<NetworkAddressHttpClient>(timer, responseHeaderTable,
      kj::Own<kj::NetworkAddress>(&addr, kj::NullDisposer::instance), kj::mv(settings));
}